

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_impl.h
# Opt level: O0

State __thiscall
packet::PacketT<packet::DefaultConfig>::nextState(PacketT<packet::DefaultConfig> *this)

{
  PacketT<packet::DefaultConfig> *this_local;
  State local_4;
  
  switch(this->reading_state_) {
  case HEAD_PATTERN:
    local_4 = DATA_SIZE;
    break;
  case DATA_SIZE:
    local_4 = DATA;
    break;
  case DATA:
    local_4 = TAIL_PATTERN;
    break;
  case TAIL_PATTERN:
    local_4 = NONE;
    break;
  default:
    local_4 = NONE;
  }
  return local_4;
}

Assistant:

inline typename PacketT<Cfg>::State
PacketT<Cfg>::nextState(void) const
{
  switch (reading_state_) {
    case State::HEAD_PATTERN: return State::DATA_SIZE;
    case State::DATA_SIZE: return State::DATA;
    case State::DATA: return (TAIL_PATTERN_SIZE > 0 ? State::TAIL_PATTERN : State::NONE);
    case State::TAIL_PATTERN: return State::NONE;
    default:
      PKT_ASSERT(false && "invalid state");
  }
  return State::NONE;
}